

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void * nn_allocmsg(size_t size,int type)

{
  int iVar1;
  int *piVar2;
  void *result;
  void *local_10;
  
  iVar1 = nn_chunk_alloc(size,type,&local_10);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
    local_10 = (void *)0x0;
  }
  return local_10;
}

Assistant:

void *nn_allocmsg (size_t size, int type)
{
    int rc;
    void *result;

    rc = nn_chunk_alloc (size, type, &result);
    if (rc == 0)
        return result;
    errno = -rc;
    return NULL;
}